

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

color_theme * color_theme_create(void)

{
  color_theme *theme;
  
  theme = (color_theme *)malloc(0x20);
  if (theme == (color_theme *)0x0) {
    theme = (color_theme *)0x0;
  }
  else {
    theme->unfocused = (color_value *)0x0;
    theme->focused = (color_value *)0x0;
    theme->urgent = (color_value *)0x0;
    theme->sticky = (color_value *)0x0;
  }
  return theme;
}

Assistant:

struct color_theme *color_theme_create(void)
{
        struct color_theme *theme = malloc(sizeof(struct color_theme));

        if (theme == NULL) {
                return NULL;
        }

        theme->unfocused = NULL;
        theme->focused = NULL;
        theme->urgent = NULL;
        theme->sticky = NULL;

        return theme;
}